

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

void __thiscall
Js::AsmJsFunctionDeclaration::SetArgCount(AsmJsFunctionDeclaration *this,ArgSlot count)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJsType *pAVar4;
  
  if (this->mArgumentsType != (AsmJsType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1e9,"(mArgumentsType == nullptr)","mArgumentsType == nullptr");
    if (!bVar2) goto LAB_0087cb18;
    *puVar3 = 0;
  }
  if (this->mArgCount != 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1ea,"(mArgCount == Constants::InvalidArgSlot)",
                                "mArgCount == Constants::InvalidArgSlot");
    if (!bVar2) goto LAB_0087cb18;
    *puVar3 = 0;
  }
  if (count == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1eb,"(count != Constants::InvalidArgSlot)",
                                "count != Constants::InvalidArgSlot");
    if (!bVar2) {
LAB_0087cb18:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this->mArgCount = 0xffff;
  }
  else {
    this->mArgCount = count;
    if (count == 0) {
      return;
    }
  }
  pAVar4 = Memory::AllocateArray<Memory::ArenaAllocator,Js::AsmJsType,false>
                     ((Memory *)this->mAllocator,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero
                      ,0,(ulong)count);
  this->mArgumentsType = pAVar4;
  return;
}

Assistant:

void AsmJsFunctionDeclaration::SetArgCount(ArgSlot count )
    {
        Assert( mArgumentsType == nullptr );
        Assert(mArgCount == Constants::InvalidArgSlot);
        Assert(count != Constants::InvalidArgSlot);
        mArgCount = count;
        if( count > 0 )
        {
            mArgumentsType = AnewArrayZ( mAllocator, AsmJsType, count );
        }
    }